

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureGLImpl::PipelineResourceSignatureGLImpl
          (PipelineResourceSignatureGLImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceGLImpl *pDeviceGL,PipelineResourceSignatureDesc *Desc,
          PipelineResourceSignatureInternalDataGL *InternalData)

{
  IMemoryAllocator *RawAllocator;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::PipelineResourceSignatureBase
            (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,pRefCounters,
             pDeviceGL,Desc,InternalData);
  (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
  .super_ObjectBase<Diligent::IPipelineResourceSignature>.
  super_RefCountedObject<Diligent::IPipelineResourceSignature>.super_IPipelineResourceSignature.
  super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00a56200;
  *(undefined8 *)
   &(this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).field_0xd2 = 0;
  this->m_DynamicUBOMask = 0;
  this->m_DynamicSSBOMask = 0;
  RawAllocator = GetRawAllocator();
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp:650:13)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp:650:13)>
             ::_M_manager;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<unsigned_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp:654:13)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<unsigned_long_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp:654:13)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  local_38._M_unused._M_object = this;
  PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::
  Deserialize<Diligent::PipelineResourceSignatureInternalDataGL>
            (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,RawAllocator,
             Desc,InternalData,true,(function<void_()> *)&local_38,
             (function<unsigned_long_()> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

PipelineResourceSignatureGLImpl::PipelineResourceSignatureGLImpl(IReferenceCounters*                            pRefCounters,
                                                                 RenderDeviceGLImpl*                            pDeviceGL,
                                                                 const PipelineResourceSignatureDesc&           Desc,
                                                                 const PipelineResourceSignatureInternalDataGL& InternalData) :
    TPipelineResourceSignatureBase{pRefCounters, pDeviceGL, Desc, InternalData}
{
    try
    {
        Deserialize(
            GetRawAllocator(), Desc, InternalData, /*CreateImmutableSamplers = */ true,
            [this]() //
            {
                CreateLayout(/*IsSerialized*/ true);
            },
            [this]() //
            {
                return ShaderResourceCacheGL::GetRequiredMemorySize(m_BindingCount);
            });
    }
    catch (...)
    {
        Destruct();
        throw;
    }
}